

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O0

void LoadBytes(AES_state *s,uchar *data16)

{
  int local_20;
  int local_1c;
  int r;
  int c;
  uchar *data16_local;
  AES_state *s_local;
  
  _r = data16;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      LoadByte(s,*_r,local_20,local_1c);
      _r = _r + 1;
    }
  }
  return;
}

Assistant:

static void LoadBytes(AES_state *s, const unsigned char* data16) {
    int c;
    for (c = 0; c < 4; c++) {
        int r;
        for (r = 0; r < 4; r++) {
            LoadByte(s, *(data16++), r, c);
        }
    }
}